

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O2

void __thiscall tcu::TestCase::~TestCase(TestCase *this)

{
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestCase_01e749f8;
  TestNode::deinit(&this->super_TestNode);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&(this->super_TestNode).m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  std::__cxx11::string::~string((string *)&(this->super_TestNode).m_description);
  std::__cxx11::string::~string((string *)&(this->super_TestNode).m_name);
  return;
}

Assistant:

TestNode::~TestNode (void)
{
	TestNode::deinit();
}